

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_branchi(dill_stream s,int op,int type,int src,long imm,int label)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  dill_stream in_R8;
  int in_R9D;
  uint tmp;
  int rex;
  int in_stack_ffffffffffffffd4;
  undefined4 uVar1;
  uint insn1;
  int local_c;
  
  insn1 = 0;
  if (((in_EDX == 6) || (in_EDX == 7)) || (in_EDX == 8)) {
    insn1 = 8;
  }
  if (((in_EDX == 1) || (in_EDX == 3)) || ((in_EDX == 5 || (in_EDX == 7)))) {
    local_c = in_ESI + 6;
  }
  else {
    local_c = in_ESI;
    if (in_EDX == 9 || in_EDX == 10) {
      fprintf(_stderr,"Shouldn\'t happen\n");
      return;
    }
  }
  if (7 < in_ECX) {
    insn1 = insn1 | 1;
  }
  if (in_R8 < (dill_stream)0x7fffffff) {
    BYTE_OUT2IR(in_R8,in_R9D,insn1,in_stack_ffffffffffffffd4,in_EDX);
  }
  else {
    x86_64_setl(in_R8,in_R9D,CONCAT44(in_stack_ffffffffffffffd4,in_EDX));
    BYTE_OUT2R(in_R8,in_R9D,insn1,in_stack_ffffffffffffffd4);
  }
  dill_mark_branch_location(in_R8,in_R9D);
  uVar1 = 0;
  if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
    extend_dill_stream(in_R8);
  }
  **(undefined1 **)(*(long *)(in_RDI + 8) + 8) = 0xf;
  *(uchar *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 1) = op_conds[local_c];
  *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 2) = uVar1;
  if (*(int *)(in_RDI + 0x18) != 0) {
    dump_cur_dill_insn((dill_stream_conflict)CONCAT44(uVar1,in_EDX));
  }
  *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 6;
  return;
}

Assistant:

extern void
x86_64_branchi(dill_stream s,
               int op,
               int type,
               int src,
               IMM_TYPE imm,
               int label)
{
    int rex = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P))
        rex |= REX_W;

    switch (type) {
    case DILL_F:
    case DILL_D:
        fprintf(stderr, "Shouldn't happen\n");
        break;
    case DILL_U:
    case DILL_UL:
    case DILL_US:
    case DILL_UC:
        /*
                switch(op) {
                case dill_bge_code: {
                    imm = imm-1;
                    op = dill_bgt_code;
                    break;
                }
                case dill_blt_code: {
                    imm = imm-1;
                    op = dill_ble_code;
                    break;
                }
                }
        */
        op += 6; /* second set of codes */
                 /* fall through */
    default:
        /*	BYTE_OUT2(s, 0x39, ModRM(0x3, src2, src1));*/
        if (src > RDI)
            rex |= REX_B;
        if (((uintptr_t)imm) < 0x7fffffff) {
            BYTE_OUT2IR(s, rex, 0x81, ModRM(0x3, 0x7, src), (int)imm); /* cmp */
        } else {
            x86_64_setl(s, EAX, imm);
            BYTE_OUT2R(s, rex, 0x39, ModRM(0x3, EAX, src));
        }
        dill_mark_branch_location(s, label);
        BYTE_OUT2I(s, 0x0f, op_conds[op], 0);
    }
}